

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

int __thiscall QtMWidgets::ToolBarLayout::spaceNeeded(ToolBarLayout *this)

{
  bool bVar1;
  int w;
  int h;
  QLayoutItem **ppQVar2;
  QList<QLayoutItem_*> *t;
  QSize local_80;
  QSize local_78;
  QLayoutItem *local_70;
  QLayoutItem *item;
  QLayoutItem **local_58;
  undefined1 local_50 [8];
  QForeachContainer<QList<QLayoutItem_*>_> _container_212;
  QSize size;
  ToolBarLayout *this_local;
  
  QSize::QSize((QSize *)&_container_212.control,0,0);
  QtPrivate::qMakeForeachContainer<QList<QLayoutItem*>const&>
            ((QForeachContainer<QList<QLayoutItem_*>_> *)local_50,(QtPrivate *)&this->buttons,t);
  while( true ) {
    local_58 = _container_212.i.i;
    bVar1 = QList<QLayoutItem_*>::const_iterator::operator!=
                      ((const_iterator *)&_container_212.c.d.size,_container_212.i);
    if (!bVar1) break;
    ppQVar2 = QList<QLayoutItem_*>::const_iterator::operator*
                        ((const_iterator *)&_container_212.c.d.size);
    local_70 = *ppQVar2;
    local_78 = (QSize)(**(code **)(*(long *)local_70 + 0x10))();
    QSize::operator+=((QSize *)&_container_212.control,&local_78);
    w = (**(code **)(*(long *)this + 0x60))();
    h = (**(code **)(*(long *)this + 0x60))();
    QSize::QSize(&local_80,w,h);
    QSize::operator+=((QSize *)&_container_212.control,&local_80);
    QList<QLayoutItem_*>::const_iterator::operator++((const_iterator *)&_container_212.c.d.size);
  }
  QtPrivate::QForeachContainer<QList<QLayoutItem_*>_>::~QForeachContainer
            ((QForeachContainer<QList<QLayoutItem_*>_> *)local_50);
  if (this->orient == Horizontal) {
    this_local._4_4_ = QSize::width((QSize *)&_container_212.control);
  }
  else {
    this_local._4_4_ = QSize::height((QSize *)&_container_212.control);
  }
  return this_local._4_4_;
}

Assistant:

int
ToolBarLayout::spaceNeeded() const
{
	QSize size( 0, 0 );

	foreach( QLayoutItem * item, buttons )
	{
		size += item->sizeHint();
		size += QSize( spacing(), spacing() );
	}

	if( orient == Qt::Horizontal )
		return size.width();
	else
		return size.height();
}